

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  char *key;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  handle hVar4;
  _Bit_pointer puVar5;
  PyTypeObject **ppPVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  type_info *find_type;
  PyObject *pPVar11;
  long lVar12;
  handle hVar13;
  undefined8 *puVar14;
  long *plVar15;
  function_record *pfVar16;
  function_record *pfVar17;
  object *poVar18;
  error_already_set *this;
  ushort uVar19;
  pointer paVar20;
  pointer paVar21;
  instance *piVar22;
  ulong uVar23;
  uint uVar24;
  uint __uval;
  PyTypeObject *pPVar25;
  pointer paVar26;
  pointer paVar27;
  pointer paVar28;
  PyTypeObject *type;
  size_type __new_size;
  char cVar29;
  uint __len;
  function_record *pfVar30;
  PyObject *tmp;
  Py_ssize_t *pPVar31;
  bool bVar32;
  handle arg;
  tuple extra_args;
  dict kwargs_1;
  loader_life_support guard_1;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  dict kwargs;
  undefined1 local_1c8 [24];
  object oStack_1b0;
  _Bit_pointer local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  _Bit_pointer local_178;
  function_record *local_170;
  instance *local_168;
  handle local_160;
  undefined1 local_158 [8];
  undefined1 auStack_150 [16];
  pointer paStack_140;
  anon_union_24_2_63b86169_for_instance_1 local_138;
  handle hStack_120;
  _Bit_pointer local_118;
  object oStack_110;
  object local_108;
  handle local_100;
  handle local_f8;
  ushort *local_f0;
  undefined1 local_e8 [32];
  handle local_c8;
  long local_c0;
  PyObject local_b8;
  PyObject *local_a8;
  pointer local_a0;
  pointer local_98;
  void *local_88;
  PyTypeObject *local_80;
  instance *local_78;
  pointer phStack_70;
  type_info *local_68;
  pointer paStack_60;
  pointer local_50;
  handle local_48;
  PyTypeObject **local_40;
  
  local_168 = (instance *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_c_cmakelists/hezhaozhao-git[P]thrift_rpc_code_generate/pybind11/include/pybind11/pybind11.h"
                  ,0x23d,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  local_98 = (pointer)args_in[1].ob_refcnt;
  if (local_98 == (pointer)0x0) {
    local_68 = (type_info *)0x0;
    paStack_60 = (pointer)0x0;
    local_78 = (instance *)0x0;
    phStack_70 = (pointer)0x0;
    if ((*(byte *)((long)&local_168[1].field_1 + 0x11) & 1) != 0) goto LAB_00130b47;
    local_f0 = (ushort *)((long)&local_168[1].field_1 + 0x11);
    pPVar25 = (PyTypeObject *)0x0;
  }
  else {
    pPVar25 = args_in[1].ob_type;
    local_f0 = (ushort *)((long)&local_168[1].field_1 + 0x11);
    local_68 = (type_info *)0x0;
    paStack_60 = (pointer)0x0;
    local_78 = (instance *)0x0;
    phStack_70 = (pointer)0x0;
    if ((*(byte *)((long)&local_168[1].field_1 + 0x11) & 1) != 0) {
      if (pPVar25 == (PyTypeObject *)0x0) {
LAB_00130b47:
        PyErr_SetString(_PyExc_TypeError,
                        "__init__(self, ...) called with invalid or missing `self` argument");
        return (PyObject *)0x0;
      }
      type = (PyTypeObject *)local_168[2].ob_base.ob_refcnt;
      if ((pPVar25->ob_base).ob_base.ob_type != type) {
        iVar9 = PyType_IsSubtype();
        if (iVar9 == 0) goto LAB_00130b47;
        type = (PyTypeObject *)local_168[2].ob_base.ob_refcnt;
      }
      find_type = detail::get_type_info(type);
      detail::instance::get_value_and_holder
                ((value_and_holder *)local_158,(instance *)pPVar25,find_type,true);
      local_68 = (type_info *)auStack_150._8_8_;
      paStack_60 = paStack_140;
      local_78 = (instance *)local_158;
      phStack_70 = (pointer)auStack_150._0_8_;
      bVar8 = (byte)((PyObject *)((long)local_158 + 0x30))->ob_refcnt;
      if ((bVar8 & 2) == 0) {
        bVar8 = *(byte *)((long)(PyObject **)auStack_150._0_8_ +
                         (long)&(((PyObject *)((long)local_158 + 0x10))->ob_type->ob_base).ob_base.
                                ob_refcnt) & 2;
      }
      else {
        bVar8 = bVar8 & 8;
      }
      if (bVar8 != 0) {
        __Py_NoneStruct = __Py_NoneStruct + 1;
        local_158 = (undefined1  [8])0x0;
        object::~object((object *)local_158);
        return (PyObject *)&_Py_NoneStruct;
      }
    }
  }
  local_e8._0_8_ = (PyObject *)0x0;
  local_e8._8_8_ = (function_record *)0x0;
  local_e8._16_8_ = (pointer)0x0;
  local_88 = local_168[2].field_1.simple_value_holder[0];
  local_40 = &args_in[1].ob_type;
  local_a8 = (PyObject *)0x1;
  hVar13.m_ptr = &local_168->ob_base;
  local_170 = (function_record *)args_in;
  local_80 = pPVar25;
  do {
    uVar19 = *(ushort *)((long)&hVar13.m_ptr[5].ob_type + 1);
    uVar24 = (uVar19 & 0x20) >> 5;
    local_50 = (pointer)((long)(short)((uint)(int)(short)(uVar19 << 9) >> 0xf) +
                        ((ulong)*(ushort *)((long)&hVar13.m_ptr[5].ob_type + 4) - (ulong)uVar24));
    paVar20 = local_50 + -(ulong)*(ushort *)((long)&hVar13.m_ptr[5].ob_type + 6);
    if (((uVar24 != 0) || (local_98 <= paVar20)) &&
       ((local_a0 = paVar20, paVar20 <= local_98 ||
        (paVar20 <= (pointer)(hVar13.m_ptr[2].ob_refcnt - (long)hVar13.m_ptr[1].ob_type >> 5))))) {
      local_138.simple_value_holder[2] = (function_record *)0x0;
      hStack_120.m_ptr = hStack_120.m_ptr & 0xffffffff00000000;
      local_138.simple_value_holder[1] =
           (void *)((ulong)local_138.simple_value_holder[1] & 0xffffffff00000000);
      paStack_140 = (pointer)0x0;
      local_138.simple_value_holder[0] = (function_record *)0x0;
      auStack_150._0_8_ = (pointer)0x0;
      auStack_150._8_8_ = (type_info *)0x0;
      local_108.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_118 = (_Bit_pointer)0x0;
      oStack_110.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_f8.m_ptr = (PyObject *)0x0;
      local_158 = (undefined1  [8])hVar13.m_ptr;
      local_100.m_ptr = (PyObject *)pPVar25;
      std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_150,
                 (ulong)*(ushort *)((long)&hVar13.m_ptr[5].ob_type + 4));
      std::vector<bool,_std::allocator<bool>_>::reserve
                ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,
                 (ulong)*(ushort *)((long)&hVar13.m_ptr[5].ob_type + 4));
      paVar20 = local_a0;
      if (local_98 < local_a0) {
        paVar20 = local_98;
      }
      if (((ulong)hVar13.m_ptr[5].ob_type & 0x200) == 0) {
        paVar26 = (pointer)0x0;
      }
      else {
        if (*(PyObject **)&paStack_60->field_0x0 != (PyObject *)0x0) {
          (*(code *)*(PyObject **)(local_68 + 0x38))(&stack0xffffffffffffff88);
        }
        if ((((PyTypeObject *)
             (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
              &((function_record *)args_in)->doc)->
             super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
             super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_c_cmakelists/hezhaozhao-git[P]thrift_rpc_code_generate/pybind11/include/pybind11/pybind11.h"
                        ,0x28a,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        local_f8.m_ptr =
             *(PyObject **)
              &(((function_record *)args_in)->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl.super__Vector_impl_data;
        local_1c8._0_8_ = &stack0xffffffffffffff88;
        if ((pointer)auStack_150._8_8_ == paStack_140) {
          std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
          _M_realloc_insert<_object*>
                    ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                     (iterator)auStack_150._8_8_,(_object **)local_1c8);
        }
        else {
          *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1c8._0_8_;
          auStack_150._8_8_ = auStack_150._8_8_ + 8;
        }
        paVar26 = (pointer)0x1;
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,false);
      }
      paVar28 = paVar26;
      if (paVar26 < paVar20) {
        uVar23 = (ulong)(uint)((int)paVar26 << 5);
        do {
          pPVar25 = hVar13.m_ptr[1].ob_type;
          if (paVar26 < (pointer)(hVar13.m_ptr[2].ob_refcnt - (long)pPVar25 >> 5)) {
            puVar14 = (undefined8 *)((long)&(pPVar25->ob_base).ob_base.ob_refcnt + uVar23);
            bVar32 = pPVar25 != (PyTypeObject *)0x0;
            if ((kwargs_in != (PyObject *)0x0) && (pPVar25 != (PyTypeObject *)0x0)) {
              bVar32 = true;
              if (((char *)*puVar14 != (char *)0x0) &&
                 (pPVar11 = detail::dict_getitemstring(kwargs_in,(char *)*puVar14),
                 pPVar11 != (PyObject *)0x0)) {
                bVar32 = false;
                args_in = (PyObject *)local_170;
                goto LAB_0013151a;
              }
            }
            if ((((PyTypeObject *)
                 (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_170->doc)->
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
LAB_0013220d:
              __assert_fail("PyTuple_Check(args_in)",
                            "/workspace/llm4binary/github/license_c_cmakelists/hezhaozhao-git[P]thrift_rpc_code_generate/pybind11/include/pybind11/pybind11.h"
                            ,0x299,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            local_1c8._0_8_ = local_170->data[(long)(paVar26 + -4)];
            args_in = (PyObject *)local_170;
            if (bVar32) {
              bVar32 = true;
              if (((*(byte *)((long)&pPVar25->tp_name + uVar23) & 2) == 0) &&
                 ((function_record *)local_1c8._0_8_ == (function_record *)&_Py_NoneStruct)) {
                bVar32 = false;
                goto LAB_0013151a;
              }
            }
            else {
              bVar32 = false;
            }
          }
          else {
            if ((((PyTypeObject *)
                 (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                  &((function_record *)args_in)->doc)->
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) goto LAB_0013220d;
            local_1c8._0_8_ = ((function_record *)args_in)->data[(long)(paVar26 + -4)];
            bVar32 = false;
            puVar14 = (undefined8 *)0x0;
          }
          if ((pointer)auStack_150._8_8_ == paStack_140) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                       (iterator)auStack_150._8_8_,(handle *)local_1c8);
          }
          else {
            *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1c8._0_8_;
            auStack_150._8_8_ = auStack_150._8_8_ + 8;
          }
          bVar8 = 1;
          if (bVar32) {
            bVar8 = *(byte *)(puVar14 + 3);
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,(bool)(bVar8 & 1));
          paVar26 = paVar26 + 1;
          uVar23 = uVar23 + 0x20;
          paVar28 = paVar20;
        } while (paVar20 != paVar26);
      }
      if (kwargs_in != (PyObject *)0x0) {
        kwargs_in->ob_refcnt = kwargs_in->ob_refcnt + 1;
      }
      paVar26 = (pointer)(ulong)*(ushort *)&hVar13.m_ptr[6].ob_refcnt;
      local_c8.m_ptr = kwargs_in;
      if (paVar28 < paVar26) {
        lVar12 = (long)paVar28 * 0x20;
        local_1c8._0_8_ = *(undefined8 *)((long)&(hVar13.m_ptr[1].ob_type)->ob_base + lVar12 + 0x10)
        ;
        if ((function_record *)local_1c8._0_8_ != (function_record *)0x0) {
          pPVar31 = (Py_ssize_t *)((long)&(hVar13.m_ptr[1].ob_type)->ob_base + lVar12);
          lVar12 = lVar12 + 0x30;
          paVar27 = paVar28;
          do {
            if ((pointer)auStack_150._8_8_ == paStack_140) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                         (iterator)auStack_150._8_8_,(handle *)local_1c8);
            }
            else {
              *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1c8._0_8_;
              auStack_150._8_8_ = auStack_150._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,
                       (bool)((byte)pPVar31[3] & 1));
            paVar28 = paVar27 + 1;
            uVar19 = *(ushort *)&hVar13.m_ptr[6].ob_refcnt;
            paVar26 = (pointer)(ulong)uVar19;
            paVar21 = (pointer)(ulong)uVar19;
            if ((pointer)(ulong)uVar19 <= paVar28) goto LAB_00130f88;
            pPVar31 = &(hVar13.m_ptr[1].ob_type)->tp_basicsize + (long)paVar27 * 4;
            local_1c8._0_8_ =
                 *(undefined8 *)
                  ((long)&((hVar13.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar12);
            lVar12 = lVar12 + 0x20;
            paVar27 = paVar28;
          } while ((function_record *)local_1c8._0_8_ != (function_record *)0x0);
        }
        local_1c8._0_8_ = (function_record *)0x0;
        paVar21 = paVar26;
LAB_00130f88:
        if (paVar21 <= paVar28) goto LAB_00130f91;
LAB_001310f2:
        bVar32 = false;
      }
      else {
LAB_00130f91:
        if (paVar28 < local_50) {
          uVar23 = (long)paVar28 << 5 | 0x18;
          bVar32 = false;
          do {
            pPVar25 = hVar13.m_ptr[1].ob_type;
            local_1c8._0_8_ = (function_record *)0x0;
            if (((kwargs_in == (PyObject *)0x0) ||
                (key = *(char **)((long)pPVar25 + (uVar23 - 0x18)), key == (char *)0x0)) ||
               (local_1c8._0_8_ = detail::dict_getitemstring(local_c8.m_ptr,key),
               (function_record *)local_1c8._0_8_ == (function_record *)0x0)) {
              pfVar30 = *(function_record **)((long)pPVar25 + (uVar23 - 8));
              if (pfVar30 != (function_record *)0x0) {
                local_1c8._0_8_ = pfVar30;
              }
            }
            else {
              if (!bVar32) {
                local_198._0_8_ = PyDict_Copy(local_c8.m_ptr);
                object::operator=((object *)&local_c8,(object *)local_198);
                object::~object((object *)local_198);
              }
              iVar9 = PyDict_DelItemString
                                (local_c8.m_ptr,*(undefined8 *)((long)pPVar25 + (uVar23 - 0x18)));
              bVar32 = true;
              if (iVar9 == -1) {
                this = (error_already_set *)__cxa_allocate_exception(0x28);
                error_already_set::error_already_set(this);
                __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set)
                ;
              }
            }
            if (((*(byte *)((long)&(pPVar25->ob_base).ob_base.ob_refcnt + uVar23) & 2) == 0 &&
                 (function_record *)local_1c8._0_8_ == (function_record *)&_Py_NoneStruct) ||
               ((function_record *)local_1c8._0_8_ == (function_record *)0x0)) {
              bVar32 = false;
              goto LAB_0013150d;
            }
            if ((pointer)auStack_150._8_8_ == paStack_140) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                         (iterator)auStack_150._8_8_,(handle *)local_1c8);
            }
            else {
              *(PyObject **)auStack_150._8_8_ = (PyObject *)local_1c8._0_8_;
              auStack_150._8_8_ = auStack_150._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,
                       (bool)(*(byte *)((long)&(pPVar25->ob_base).ob_base.ob_refcnt + uVar23) & 1));
            paVar28 = paVar28 + 1;
            uVar23 = uVar23 + 0x20;
          } while (paVar28 < local_50);
        }
        if ((function_record *)local_c8.m_ptr == (function_record *)0x0) {
          uVar19 = *(ushort *)((long)&hVar13.m_ptr[5].ob_type + 1);
        }
        else {
          lVar12 = PyDict_Size();
          uVar19 = *(ushort *)((long)&hVar13.m_ptr[5].ob_type + 1);
          if ((lVar12 != 0) && ((uVar19 & 0x40) == 0)) goto LAB_001310f2;
        }
        if ((uVar19 & 0x20) != 0) {
          tuple::tuple((tuple *)local_198,0);
          if (paVar20 == (pointer)0x0) {
            ((function_record *)args_in)->name =
                 (char *)((long)&((function_record *)((function_record *)args_in)->name)->name + 1);
            local_1c8._0_8_ = args_in;
LAB_001311ef:
            object::operator=((object *)local_198,(object *)local_1c8);
            object::~object((object *)local_1c8);
          }
          else {
            pfVar30 = (function_record *)(local_98 + -(long)paVar28);
            if (local_98 < paVar28 || pfVar30 == (function_record *)0x0) {
              tuple::tuple((tuple *)local_1c8,0);
              goto LAB_001311ef;
            }
            tuple::tuple((tuple *)local_1c8,(size_t)pfVar30);
            object::operator=((object *)local_198,(object *)local_1c8);
            object::~object((object *)local_1c8);
            ppPVar6 = local_40;
            pfVar16 = (function_record *)0x0;
            do {
              if ((((PyTypeObject *)
                   (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                    &((function_record *)args_in)->doc)->
                   super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
                   super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_c_cmakelists/hezhaozhao-git[P]thrift_rpc_code_generate/pybind11/include/pybind11/pybind11.h"
                              ,0x2f4,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1c8._8_8_ = local_198._0_8_;
              oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
              local_1c8._16_8_ = pfVar16;
              detail::accessor_policies::tuple_item::set
                        ((handle)local_198._0_8_,(size_t)pfVar16,
                         (PyObject *)ppPVar6[(long)((long)&pfVar16->name + (long)paVar28)]);
              object::~object((object *)(local_1c8 + 0x18));
              pfVar16 = (function_record *)((long)&pfVar16->name + 1);
            } while (pfVar30 != pfVar16);
          }
          if ((pointer)auStack_150._8_8_ == paStack_140) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                       (iterator)auStack_150._8_8_,(handle *)local_198);
          }
          else {
            *(PyObject **)auStack_150._8_8_ = (PyObject *)local_198._0_8_;
            auStack_150._8_8_ = auStack_150._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,false);
          object::operator=(&oStack_110,(object *)local_198);
          object::~object((object *)local_198);
          uVar19 = *(ushort *)((long)&hVar13.m_ptr[5].ob_type + 1);
        }
        if ((uVar19 & 0x40) != 0) {
          if ((function_record *)local_c8.m_ptr == (function_record *)0x0) {
            dict::dict((dict *)local_1c8);
            object::operator=((object *)&local_c8,(object *)local_1c8);
            object::~object((object *)local_1c8);
          }
          if ((pointer)auStack_150._8_8_ == paStack_140) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_150,
                       (iterator)auStack_150._8_8_,&local_c8);
          }
          else {
            *(PyObject **)auStack_150._8_8_ = local_c8.m_ptr;
            auStack_150._8_8_ = auStack_150._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_138.nonsimple,false);
          object::operator=(&local_108,(object *)&local_c8);
        }
        __new_size = (long)(auStack_150._8_8_ - auStack_150._0_8_) >> 3;
        if ((__new_size != *(ushort *)((long)&hVar13.m_ptr[5].ob_type + 4)) ||
           (((ulong)hStack_120.m_ptr & 0xffffffff) +
            ((long)local_138.simple_value_holder[2] - local_138._0_8_) * 8 != __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        local_198._0_8_ = (PyObject *)0x0;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        local_188._0_8_ = (function_record *)0x0;
        local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
        local_178 = (_Bit_pointer)0x0;
        if (local_88 != (void *)0x0) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)local_198,__new_size,false);
          puVar5 = local_118;
          hVar4.m_ptr = hStack_120.m_ptr;
          uVar3 = local_138.simple_value_holder[2];
          uVar2 = local_138.simple_value_holder[1];
          uVar1 = local_138.simple_value_holder[0];
          local_1a8 = local_118;
          local_1c8._16_8_ = local_138.simple_value_holder[2];
          oStack_1b0.super_handle.m_ptr = (handle)(handle)hStack_120.m_ptr;
          local_1c8._0_8_ = local_138.simple_value_holder[0];
          local_1c8._8_8_ = local_138.simple_value_holder[1];
          local_118 = local_178;
          local_138.simple_value_holder[2] = (void *)local_188._0_8_;
          hStack_120.m_ptr = (PyObject *)local_188._8_8_;
          local_138.simple_value_holder[0] = (void *)local_198._0_8_;
          local_138.simple_value_holder[1] = (void *)local_198._8_8_;
          local_178 = puVar5;
          local_188._0_8_ = uVar3;
          local_188._8_8_ = hVar4.m_ptr;
          local_198._0_8_ = uVar1;
          local_198._8_8_ = uVar2;
        }
        detail::loader_life_support::loader_life_support((loader_life_support *)local_1c8);
        local_a8 = (PyObject *)(*(code *)hVar13.m_ptr[3].ob_refcnt)(local_158);
        detail::loader_life_support::~loader_life_support((loader_life_support *)local_1c8);
        puVar5 = local_118;
        hVar4.m_ptr = hStack_120.m_ptr;
        uVar3 = local_138.simple_value_holder[2];
        uVar2 = local_138.simple_value_holder[1];
        uVar1 = local_138.simple_value_holder[0];
        bVar32 = local_a8 != (PyObject *)0x1;
        if (local_88 != (void *)0x0 && !bVar32) {
          for (paVar20 = (pointer)(ulong)(*(ushort *)((long)&hVar13.m_ptr[5].ob_type + 1) >> 4 & 1);
              paVar20 < local_a0; paVar20 = paVar20 + 1) {
            paVar26 = paVar20 + 0x3f;
            if (-1 < (long)paVar20) {
              paVar26 = paVar20;
            }
            if ((*(ulong *)(local_198._0_8_ +
                           (ulong)(((ulong)paVar20 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)paVar26 >> 6) * 8 + -8) >> ((ulong)paVar20 & 0x3f) & 1) != 0) {
              local_1a8 = local_118;
              local_1c8._16_8_ = local_138.simple_value_holder[2];
              oStack_1b0.super_handle.m_ptr = (handle)(handle)hStack_120.m_ptr;
              local_1c8._0_8_ = local_138.simple_value_holder[0];
              local_1c8._8_8_ = local_138.simple_value_holder[1];
              local_118 = local_178;
              local_138.simple_value_holder[2] = (void *)local_188._0_8_;
              hStack_120.m_ptr = (PyObject *)local_188._8_8_;
              local_138.simple_value_holder[0] = (void *)local_198._0_8_;
              local_138.simple_value_holder[1] = (void *)local_198._8_8_;
              local_178 = puVar5;
              local_188._0_8_ = uVar3;
              local_188._8_8_ = hVar4.m_ptr;
              local_198._0_8_ = uVar1;
              local_198._8_8_ = uVar2;
              std::
              vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
              ::emplace_back<pybind11::detail::function_call>
                        ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                          *)local_e8,(function_call *)local_158);
              break;
            }
          }
          bVar32 = false;
        }
        if ((function_record *)local_198._0_8_ != (function_record *)0x0) {
          operator_delete((void *)local_198._0_8_);
        }
      }
LAB_0013150d:
      object::~object((object *)&local_c8);
LAB_0013151a:
      object::~object(&local_108);
      object::~object(&oStack_110);
      if ((function_record *)local_138.simple_value_holder[0] != (function_record *)0x0) {
        operator_delete(local_138.simple_value_holder[0]);
        local_138.simple_value_holder[0] = (function_record *)0x0;
        local_138.simple_value_holder[1] =
             (void *)((ulong)local_138.simple_value_holder[1] & 0xffffffff00000000);
        local_138.simple_value_holder[2] = (function_record *)0x0;
        hStack_120.m_ptr = hStack_120.m_ptr & 0xffffffff00000000;
        local_118 = (_Bit_pointer)0x0;
      }
      if ((pointer)auStack_150._0_8_ != (pointer)0x0) {
        operator_delete((void *)auStack_150._0_8_);
      }
      pPVar25 = local_80;
      if (bVar32) break;
    }
    hVar13.m_ptr = (PyObject *)hVar13.m_ptr[8].ob_refcnt;
  } while ((instance *)hVar13.m_ptr != (instance *)0x0);
  hVar13.m_ptr = local_a8;
  uVar1 = local_e8._8_8_;
  if ((local_88 == (void *)0x0) || (local_e8._0_8_ == local_e8._8_8_)) {
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_e8);
    if (hVar13.m_ptr == (PyObject *)0x1) goto LAB_001317c5;
  }
  else {
    if (local_a8 == (PyObject *)0x1) {
      pfVar30 = (function_record *)local_e8._0_8_;
      do {
        detail::loader_life_support::loader_life_support((loader_life_support *)local_158);
        hVar13 = (*((function_record *)pfVar30->name)->impl)((function_call *)pfVar30);
        detail::loader_life_support::~loader_life_support((loader_life_support *)local_158);
        if (hVar13.m_ptr != (PyObject *)0x1) goto LAB_0013161e;
        pfVar30 = (function_record *)&pfVar30->def;
      } while (pfVar30 != (function_record *)uVar1);
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 *)local_e8);
LAB_001317c5:
      if ((*local_f0 & 8) != 0) {
        __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
        return (PyObject *)&_Py_NotImplementedStruct;
      }
      std::__cxx11::string::string
                ((string *)local_e8,(char *)(local_168->ob_base).ob_refcnt,(allocator *)&local_160);
      puVar14 = (undefined8 *)std::__cxx11::string::append(local_e8);
      pfVar30 = (function_record *)(puVar14 + 2);
      if ((function_record *)*puVar14 == pfVar30) {
        local_188._0_8_ = pfVar30->name;
        local_188._8_8_ = puVar14[3];
        local_198._0_8_ = (PyObject *)local_188;
      }
      else {
        local_188._0_8_ = pfVar30->name;
        local_198._0_8_ = (PyObject *)*puVar14;
      }
      local_198._8_8_ = puVar14[1];
      *puVar14 = pfVar30;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      iVar9 = 0x39edca;
      if ((*local_f0 & 1) != 0) {
        iVar9 = 0x3788a4;
      }
      local_c8.m_ptr = &local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,iVar9,iVar9 + (*local_f0 & 1) * 3 + 8);
      pfVar30 = (function_record *)((long)(function_record **)local_198._8_8_ + local_c0);
      pfVar16 = (function_record *)0xf;
      if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
        pfVar16 = (function_record *)local_188._0_8_;
      }
      if (pfVar16 < pfVar30) {
        pfVar16 = (function_record *)0xf;
        if (local_c8.m_ptr != &local_b8) {
          pfVar16 = (function_record *)local_b8.ob_refcnt;
        }
        if (pfVar16 < pfVar30) goto LAB_001318e5;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_198._0_8_);
      }
      else {
LAB_001318e5:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append(local_198,(ulong)local_c8.m_ptr);
      }
      local_1c8._0_8_ = local_1c8 + 0x10;
      pfVar30 = (function_record *)(puVar14 + 2);
      if ((function_record *)*puVar14 == pfVar30) {
        local_1c8._16_8_ = pfVar30->name;
        oStack_1b0.super_handle.m_ptr = (handle)puVar14[3];
      }
      else {
        local_1c8._16_8_ = pfVar30->name;
        local_1c8._0_8_ = (function_record *)*puVar14;
      }
      local_1c8._8_8_ = puVar14[1];
      *puVar14 = pfVar30;
      puVar14[1] = 0;
      *(undefined1 *)&pfVar30->name = 0;
      plVar15 = (long *)std::__cxx11::string::append(local_1c8);
      local_158 = (undefined1  [8])(auStack_150 + 8);
      piVar22 = (instance *)(plVar15 + 2);
      if ((instance *)*plVar15 == piVar22) {
        auStack_150._8_8_ = (piVar22->ob_base).ob_refcnt;
        paStack_140 = (pointer)plVar15[3];
      }
      else {
        auStack_150._8_8_ = (piVar22->ob_base).ob_refcnt;
        local_158 = (undefined1  [8])*plVar15;
      }
      auStack_150._0_8_ = plVar15[1];
      *plVar15 = (long)piVar22;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_);
      }
      if (local_c8.m_ptr != &local_b8) {
        operator_delete(local_c8.m_ptr);
      }
      if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
        operator_delete((void *)local_198._0_8_);
      }
      if ((function_record *)local_e8._0_8_ != (function_record *)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_);
      }
      uVar24 = 0;
      do {
        __val = uVar24 + 1;
        __len = 1;
        if (8 < uVar24) {
          uVar23 = (ulong)__val;
          uVar24 = 4;
          do {
            __len = uVar24;
            uVar10 = (uint)uVar23;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_00131a61;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_00131a61;
            }
            if (uVar10 < 10000) goto LAB_00131a61;
            uVar23 = uVar23 / 10000;
            uVar24 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_00131a61:
        local_e8._0_8_ = local_e8 + 0x10;
        std::__cxx11::string::_M_construct((ulong)local_e8,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8._0_8_,__len,__val);
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x379164);
        pfVar30 = (function_record *)(puVar14 + 2);
        if ((function_record *)*puVar14 == pfVar30) {
          local_188._0_8_ = pfVar30->name;
          local_188._8_8_ = puVar14[3];
          local_198._0_8_ = (PyObject *)local_188;
        }
        else {
          local_188._0_8_ = pfVar30->name;
          local_198._0_8_ = (PyObject *)*puVar14;
        }
        local_198._8_8_ = puVar14[1];
        *puVar14 = pfVar30;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append(local_198);
        local_1c8._0_8_ = local_1c8 + 0x10;
        pfVar30 = (function_record *)(puVar14 + 2);
        if ((function_record *)*puVar14 == pfVar30) {
          local_1c8._16_8_ = pfVar30->name;
          oStack_1b0.super_handle.m_ptr = (handle)puVar14[3];
        }
        else {
          local_1c8._16_8_ = pfVar30->name;
          local_1c8._0_8_ = (function_record *)*puVar14;
        }
        local_1c8._8_8_ = puVar14[1];
        *puVar14 = pfVar30;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_158,local_1c8._0_8_);
        if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_);
        }
        if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
          operator_delete((void *)local_198._0_8_);
        }
        if ((function_record *)local_e8._0_8_ != (function_record *)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_);
        }
        if ((*local_f0 & 1) == 0) {
LAB_00131cdf:
          std::__cxx11::string::append((char *)local_158);
        }
        else {
          std::__cxx11::string::string
                    ((string *)local_1c8,(char *)(local_168->field_1).simple_value_holder[0],
                     (allocator *)local_198);
          cVar29 = (char)(string *)local_1c8;
          lVar12 = std::__cxx11::string::find(cVar29,0x28);
          pfVar30 = (function_record *)(lVar12 + 7);
          if ((ulong)local_1c8._8_8_ <= pfVar30) {
LAB_00131cbe:
            if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
              operator_delete((void *)local_1c8._0_8_);
            }
            goto LAB_00131cdf;
          }
          pfVar16 = (function_record *)std::__cxx11::string::find((char *)local_1c8,0x3a9be2,0);
          std::__cxx11::string::rfind((char *)local_1c8,0x3a686f,0xffffffffffffffff);
          if (pfVar16 < (ulong)local_1c8._8_8_) {
            pfVar17 = (function_record *)((long)&pfVar16->name + 2);
          }
          else {
            pfVar17 = (function_record *)std::__cxx11::string::find(cVar29,0x29);
            pfVar16 = pfVar17;
          }
          if ((pfVar16 <= pfVar30) || ((ulong)local_1c8._8_8_ <= pfVar17)) goto LAB_00131cbe;
          std::__cxx11::string::append((string *)local_158,(ulong)local_1c8,(ulong)pfVar30);
          std::__cxx11::string::push_back((char)(string *)local_158);
          std::__cxx11::string::append((string *)local_158,(ulong)local_1c8,(ulong)pfVar17);
          if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_);
          }
        }
        std::__cxx11::string::append((char *)local_158);
        local_168 = (instance *)local_168[2].field_1.simple_value_holder[0];
        uVar24 = __val;
      } while (local_168 != (instance *)0x0);
      std::__cxx11::string::append(local_158);
      local_c8.m_ptr = (PyObject *)local_170;
      if (local_170 != (function_record *)0x0) {
        local_170->name = (char *)((long)&((function_record *)local_170->name)->name + 1);
      }
      bVar32 = false;
      for (pfVar30 = (function_record *)(ulong)(*local_f0 & 1);
          pfVar16 = (function_record *)PyTuple_Size(local_c8.m_ptr), pfVar30 < pfVar16;
          pfVar30 = (function_record *)((long)&pfVar30->name + 1)) {
        bVar7 = true;
        if (bVar32) {
          std::__cxx11::string::append(local_158);
          bVar7 = bVar32;
        }
        bVar32 = bVar7;
        local_198._8_8_ = local_c8.m_ptr;
        local_188._8_8_ = (PyObject *)0x0;
        local_188._0_8_ = pfVar30;
        poVar18 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_198)
        ;
        local_160.m_ptr = (poVar18->super_handle).m_ptr;
        if ((function_record *)local_160.m_ptr != (function_record *)0x0) {
          ((function_record *)local_160.m_ptr)->name =
               (char *)((long)&((function_record *)((function_record *)local_160.m_ptr)->name)->name
                       + 1);
        }
        hVar13.m_ptr = (PyObject *)PyObject_Repr(local_160.m_ptr);
        if ((function_record *)hVar13.m_ptr == (function_record *)0x0) {
          local_170 = (function_record *)__cxa_allocate_exception(0x28);
          error_already_set::error_already_set((error_already_set *)local_170);
          __cxa_throw(local_170,&error_already_set::typeinfo,error_already_set::~error_already_set);
        }
        local_e8._0_8_ = hVar13.m_ptr;
        pybind11::str::operator_cast_to_string((string *)local_1c8,(str *)local_e8);
        std::__cxx11::string::_M_append(local_158,local_1c8._0_8_);
        if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_);
        }
        object::~object((object *)local_e8);
        object::~object((object *)&local_160);
        object::~object((object *)(local_188 + 8));
      }
      if (kwargs_in != (PyObject *)0x0) {
        kwargs_in->ob_refcnt = kwargs_in->ob_refcnt + 1;
        local_160.m_ptr = kwargs_in;
        lVar12 = PyDict_Size();
        if (lVar12 != 0) {
          if (bVar32) {
            std::__cxx11::string::append(local_158);
          }
          std::__cxx11::string::append(local_158);
          local_1c8._0_8_ = local_160.m_ptr;
          local_1c8._8_8_ = (function_record *)0x0;
          local_1c8._16_8_ = (function_record *)0x0;
          oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          iVar9 = PyDict_Next(local_160.m_ptr,local_1c8 + 0x18,local_1c8 + 8,local_1c8 + 0x10);
          if ((iVar9 != 0) && (oStack_1b0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff)) {
            local_e8._0_8_ = local_1c8._8_8_;
            local_e8._8_8_ = local_1c8._16_8_;
            while( true ) {
              pybind11::str::str((str *)&stack0xffffffffffffffc8,"{}=");
              pybind11::str::format<pybind11::handle&>
                        ((str *)&stack0xffffffffffffffb8,(handle *)&stack0xffffffffffffffc8);
              pybind11::str::operator_cast_to_string
                        ((string *)local_198,(str *)&stack0xffffffffffffffb8);
              std::__cxx11::string::_M_append(local_158,local_198._0_8_);
              if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
                operator_delete((void *)local_198._0_8_);
              }
              object::~object((object *)&stack0xffffffffffffffb8);
              object::~object((object *)&stack0xffffffffffffffc8);
              hVar13.m_ptr = (PyObject *)PyObject_Repr(local_e8._8_8_);
              if (hVar13.m_ptr == (PyObject *)0x0) {
                local_170 = (function_record *)__cxa_allocate_exception(0x28);
                error_already_set::error_already_set((error_already_set *)local_170);
                __cxa_throw(local_170,&error_already_set::typeinfo,
                            error_already_set::~error_already_set);
              }
              local_48.m_ptr = hVar13.m_ptr;
              pybind11::str::operator_cast_to_string
                        ((string *)local_198,(str *)&stack0xffffffffffffffb8);
              std::__cxx11::string::_M_append(local_158,local_198._0_8_);
              if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
                operator_delete((void *)local_198._0_8_);
              }
              object::~object((object *)&stack0xffffffffffffffb8);
              iVar9 = PyDict_Next(local_1c8._0_8_,local_1c8 + 0x18,local_1c8 + 8,local_1c8 + 0x10);
              if ((iVar9 == 0) || (oStack_1b0.super_handle.m_ptr == (PyObject *)0xffffffffffffffff))
              break;
              local_e8._0_8_ = local_1c8._8_8_;
              local_e8._8_8_ = local_1c8._16_8_;
              std::__cxx11::string::append(local_158);
            }
          }
        }
        object::~object((object *)&local_160);
      }
      lVar12 = std::__cxx11::string::find(local_158,0x378b69,0);
      if (lVar12 != -1) {
        std::__cxx11::string::append(local_158);
      }
      PyErr_SetString(_PyExc_TypeError,local_158);
      object::~object((object *)&local_c8);
      if (local_158 == (undefined1  [8])(auStack_150 + 8)) {
        return (PyObject *)0x0;
      }
      goto LAB_001321f0;
    }
LAB_0013161e:
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_e8);
  }
  if (hVar13.m_ptr != (PyObject *)0x0) {
    if ((*local_f0 & 1) == 0) {
      return hVar13.m_ptr;
    }
    if ((local_78->field_0x30 & 2) == 0) {
      bVar8 = (local_78->field_1).nonsimple.status[(long)phStack_70] & 1;
    }
    else {
      bVar8 = local_78->field_0x30 & 4;
    }
    if (bVar8 == 0) {
      (*(code *)*(PyObject **)&local_68[0x30].field_0x0)(local_80,0);
      return hVar13.m_ptr;
    }
    return hVar13.m_ptr;
  }
  local_158 = (undefined1  [8])(auStack_150 + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_158,
             "Unable to convert function return value to a Python type! The signature was\n\t","");
  std::__cxx11::string::append(local_158);
  lVar12 = std::__cxx11::string::find(local_158,0x378b69,0);
  if (lVar12 != -1) {
    std::__cxx11::string::append(local_158);
  }
  PyErr_SetString(_PyExc_TypeError,local_158);
  if (local_158 == (undefined1  [8])(auStack_150 + 8)) {
    return (PyObject *)0x0;
  }
LAB_001321f0:
  operator_delete((void *)local_158);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            if (!parent || !PyObject_TypeCheck(parent.ptr(), (PyTypeObject *) overloads->scope.ptr())) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid or missing `self` argument");
                return nullptr;
            }

            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, true);

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && dict_getitemstring(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];
                        handle value;

                        if (arg_rec.value) {
                            value = arg_rec.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg_rec = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg_rec.name)
                            value = dict_getitemstring(kwargs.ptr(), arg_rec.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            if (PyDict_DelItemString(kwargs.ptr(), arg_rec.name) == -1) {
                                throw error_already_set();
                            }
                        } else if (arg_rec.value) {
                            value = arg_rec.value;
                        }

                        if (!arg_rec.none && value.is_none()) {
                            break;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg_rec.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#ifdef __GLIBCXX__
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        }
        if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        }
        if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
            auto *pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder.type->init_instance(pi, nullptr);
        }
        return result.ptr();
    }